

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

string * __thiscall
anon_unknown.dwarf_e82c04::cmEnumPathSegmentsGenerator::GetNextCandidate
          (string *__return_storage_ptr__,cmEnumPathSegmentsGenerator *this,string *parent)

{
  string *a;
  bool bVar1;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this_00;
  reference args;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_38;
  char local_29;
  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_28;
  string *local_20;
  string *parent_local;
  cmEnumPathSegmentsGenerator *this_local;
  
  local_20 = parent;
  parent_local = (string *)this;
  this_local = (cmEnumPathSegmentsGenerator *)__return_storage_ptr__;
  this_00 = std::
            reference_wrapper<const_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            ::get(&this->Names);
  local_28._M_current =
       (basic_string_view<char,_std::char_traits<char>_> *)
       std::
       vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ::cend(this_00);
  bVar1 = __gnu_cxx::operator!=(&this->Current,&local_28);
  a = local_20;
  if (bVar1) {
    local_29 = '/';
    local_38 = __gnu_cxx::
               __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               ::operator++(&this->Current,0);
    args = __gnu_cxx::
           __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
           ::operator*(&local_38);
    cmStrCat<std::__cxx11::string_const&,char,std::basic_string_view<char,std::char_traits<char>>const&>
              (__return_storage_ptr__,a,&local_29,args);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetNextCandidate(const std::string& parent)
  {
    if (this->Current != this->Names.get().cend()) {
      return cmStrCat(parent, '/', *this->Current++);
    }
    return {};
  }